

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geoplg.cpp
# Opt level: O3

Stream * rw::writeNativeData(Stream *stream,int32 len,void *object,int32 o,int32 s)

{
  Stream *pSVar1;
  
  if (*(undefined4 **)((long)object + 0x98) != (undefined4 *)0x0) {
    switch(**(undefined4 **)((long)object + 0x98)) {
    case 4:
      pSVar1 = ps2::writeNativeData(stream,len,object,o,s);
      return pSVar1;
    case 5:
      pSVar1 = xbox::writeNativeData(stream,len,object,o,s);
      return pSVar1;
    case 8:
      pSVar1 = d3d8::writeNativeData(stream,len,object,o,s);
      return pSVar1;
    case 9:
      pSVar1 = d3d9::writeNativeData(stream,len,object,o,s);
      return pSVar1;
    case 0xb:
      pSVar1 = wdgl::writeNativeData(stream,len,object,o,s);
      return pSVar1;
    }
  }
  return stream;
}

Assistant:

static Stream*
writeNativeData(Stream *stream, int32 len, void *object, int32 o, int32 s)
{
	Geometry *geometry = (Geometry*)object;
	if(geometry->instData == nil)
		return stream;
	if(geometry->instData->platform == PLATFORM_PS2)
		return ps2::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_WDGL)
		return wdgl::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_XBOX)
		return xbox::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_D3D8)
		return d3d8::writeNativeData(stream, len, object, o, s);
	else if(geometry->instData->platform == PLATFORM_D3D9)
		return d3d9::writeNativeData(stream, len, object, o, s);
	return stream;
}